

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

fdb_status fdb_kvs_cmp_check(fdb_kvs_handle *handle)

{
  uint8_t uVar1;
  fdb_file_handle *pfVar2;
  filemgr *pfVar3;
  fdb_custom_cmp_variable p_Var4;
  void *pvVar5;
  list *plVar6;
  list_elem *plVar7;
  list_elem *plVar8;
  list_elem *plVar9;
  ulong uVar10;
  avl_node *paVar11;
  int iVar12;
  fdb_status fVar13;
  avl_node *paVar14;
  kvs_header *pkVar15;
  char *pcVar16;
  size_t line_number;
  char *pcVar17;
  kvs_node query;
  
  pfVar2 = handle->fhandle;
  pfVar3 = handle->file;
  pthread_spin_lock(&pfVar3->kv_header->lock);
  pkVar15 = pfVar3->kv_header;
  uVar1 = pkVar15->custom_cmp_enabled;
  p_Var4 = pkVar15->default_kvs_cmp;
  pvVar5 = pkVar15->default_kvs_cmp_param;
  plVar6 = pfVar2->cmp_func_list;
  if (plVar6 != (list *)0x0) {
    (handle->kvs_config).custom_cmp = (fdb_custom_cmp_variable)0x0;
    (handle->kvs_config).custom_cmp_param = (void *)0x0;
    for (plVar7 = plVar6->head; plVar7 != (list_elem *)0x0; plVar7 = plVar7->next) {
      plVar8 = plVar7[-2].next;
      if ((plVar8 == (list_elem *)0x0) || (iVar12 = strcmp((char *)plVar8,"default"), iVar12 == 0))
      {
        plVar8 = plVar7[-1].prev;
        (handle->kvs_config).custom_cmp = (fdb_custom_cmp_variable)plVar8;
        plVar9 = plVar7[-1].next;
        (handle->kvs_config).custom_cmp_param = plVar9;
        pkVar15 = pfVar3->kv_header;
        pkVar15->default_kvs_cmp = (fdb_custom_cmp_variable)plVar8;
        pkVar15->default_kvs_cmp_param = plVar9;
LAB_0013e350:
        pkVar15->custom_cmp_enabled = '\x01';
      }
      else {
        query.kvs_name = (char *)plVar8;
        paVar14 = avl_search(pfVar3->kv_header->idx_name,&query.avl_name,_kvs_cmp_name);
        if (paVar14 != (avl_node *)0x0) {
          if (paVar14[-6].right == (avl_node *)0x0) {
            paVar11 = (avl_node *)plVar7[-1].next;
            paVar14[-6].right = (avl_node *)plVar7[-1].prev;
            paVar14[-5].parent = paVar11;
          }
          pkVar15 = pfVar3->kv_header;
          goto LAB_0013e350;
        }
      }
    }
  }
  uVar10 = pfVar2->flags;
  if ((uVar10 & 2) != 0) {
    if ((uVar10 & 4) != 0) {
      if ((handle->kvs_config).custom_cmp == (fdb_custom_cmp_variable)0x0) {
        pkVar15 = pfVar3->kv_header;
        pkVar15->custom_cmp_enabled = uVar1;
        pkVar15->default_kvs_cmp = p_Var4;
        pkVar15->default_kvs_cmp_param = pvVar5;
        pthread_spin_unlock(&pkVar15->lock);
        pcVar16 = _fdb_kvs_get_name(handle,handle->file);
        pcVar17 = "default";
        if (pcVar16 != (char *)0x0) {
          pcVar17 = pcVar16;
        }
        pcVar16 = 
        "Error! Tried to open a KV store \'%s\', which was created with custom compare function enabled, without passing the same custom compare function."
        ;
        line_number = 400;
        goto LAB_0013e5a2;
      }
      if ((uVar10 & 4) != 0) goto LAB_0013e36e;
    }
    if ((handle->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x0) {
      pkVar15 = pfVar3->kv_header;
      pkVar15->custom_cmp_enabled = uVar1;
      pkVar15->default_kvs_cmp = p_Var4;
      pkVar15->default_kvs_cmp_param = pvVar5;
      pthread_spin_unlock(&pkVar15->lock);
      pcVar16 = _fdb_kvs_get_name(handle,handle->file);
      pcVar17 = "default";
      if (pcVar16 != (char *)0x0) {
        pcVar17 = pcVar16;
      }
      pcVar16 = 
      "Error! Tried to open a KV store \'%s\', which was created without custom compare function, by passing custom compare function."
      ;
      line_number = 0x1a2;
      goto LAB_0013e5a2;
    }
  }
LAB_0013e36e:
  paVar14 = avl_first(pfVar3->kv_header->idx_name);
joined_r0x0013e381:
  do {
    paVar11 = paVar14;
    if (paVar11 == (avl_node *)0x0) {
      pthread_spin_unlock(&pfVar3->kv_header->lock);
      return FDB_RESULT_SUCCESS;
    }
    paVar14 = avl_next(paVar11);
    if (((ulong)paVar11[-6].left & 1) != 0) {
      if (paVar11[-6].right == (avl_node *)0x0) {
        pkVar15 = pfVar3->kv_header;
        pkVar15->custom_cmp_enabled = uVar1;
        pkVar15->default_kvs_cmp = p_Var4;
        pkVar15->default_kvs_cmp_param = pvVar5;
        pthread_spin_unlock(&pkVar15->lock);
        pcVar16 = _fdb_kvs_get_name(handle,handle->file);
        pcVar17 = "default";
        if (pcVar16 != (char *)0x0) {
          pcVar17 = pcVar16;
        }
        pcVar16 = 
        "Error! Tried to open a KV store \'%s\', which was created with custom compare function enabled, without passing the same custom compare function."
        ;
        line_number = 0x1bc;
        goto LAB_0013e5a2;
      }
      if (((ulong)paVar11[-6].left & 1) != 0) goto joined_r0x0013e381;
    }
  } while (paVar11[-6].right == (avl_node *)0x0);
  pkVar15 = pfVar3->kv_header;
  pkVar15->custom_cmp_enabled = uVar1;
  pkVar15->default_kvs_cmp = p_Var4;
  pkVar15->default_kvs_cmp_param = pvVar5;
  pthread_spin_unlock(&pkVar15->lock);
  pcVar16 = _fdb_kvs_get_name(handle,handle->file);
  pcVar17 = "default";
  if (pcVar16 != (char *)0x0) {
    pcVar17 = pcVar16;
  }
  pcVar16 = 
  "Error! Tried to open a KV store \'%s\', which was created without custom compare function, by passing custom compare function."
  ;
  line_number = 0x1ce;
LAB_0013e5a2:
  fVar13 = fdb_log_impl(&handle->log_callback,2,FDB_RESULT_INVALID_CMP_FUNCTION,
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                        ,"fdb_kvs_cmp_check",line_number,pcVar16,pcVar17);
  return fVar13;
}

Assistant:

fdb_status fdb_kvs_cmp_check(fdb_kvs_handle *handle)
{
    int ori_flag;
    fdb_file_handle *fhandle = handle->fhandle;
    fdb_custom_cmp_variable ori_custom_cmp;
    void* ori_custom_param;
    struct filemgr *file = handle->file;
    struct cmp_func_node *cmp_node;
    struct kvs_node *kvs_node, query;
    struct list_elem *e;
    struct avl_node *a;

    spin_lock(&file->kv_header->lock);
    ori_flag = file->kv_header->custom_cmp_enabled;
    ori_custom_cmp = file->kv_header->default_kvs_cmp;
    ori_custom_param = file->kv_header->default_kvs_cmp_param;

    // Assign from `fhandle->cmp_func_list` to `file->kv_header`.
    if (fhandle->cmp_func_list) {
        handle->kvs_config.custom_cmp = NULL;
        handle->kvs_config.custom_cmp_param = NULL;

        e = list_begin(fhandle->cmp_func_list);
        while (e) {
            cmp_node = _get_entry(e, struct cmp_func_node, le);
            if ( cmp_node->kvs_name == NULL ||
                 !strcmp(cmp_node->kvs_name, default_kvs_name) ) { // default KVS
                handle->kvs_config.custom_cmp = cmp_node->func;
                handle->kvs_config.custom_cmp_param = cmp_node->user_param;
                file->kv_header->default_kvs_cmp = cmp_node->func;
                file->kv_header->default_kvs_cmp_param = cmp_node->user_param;
                file->kv_header->custom_cmp_enabled = 1;
            } else {
                // search by name
                query.kvs_name = cmp_node->kvs_name;
                a = avl_search(file->kv_header->idx_name,
                               &query.avl_name,
                               _kvs_cmp_name);
                if (a) { // found
                    kvs_node = _get_entry(a, struct kvs_node, avl_name);
                    if (!kvs_node->custom_cmp) {
                        kvs_node->custom_cmp = cmp_node->func;
                        kvs_node->user_param = cmp_node->user_param;
                    }
                    file->kv_header->custom_cmp_enabled = 1;
                }
            }
            e = list_next(&cmp_node->le);
        }
    }

    // first check the default KVS
    // 1. root handle has not been opened yet: don't care
    // 2. root handle was opened before: must match the flag
    if (fhandle->flags & FHANDLE_ROOT_INITIALIZED) {
        if (fhandle->flags & FHANDLE_ROOT_CUSTOM_CMP &&
            handle->kvs_config.custom_cmp == NULL) {
            // custom cmp function was assigned before,
            // but no custom cmp function is assigned
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created with "
                           "custom compare function enabled, without passing the same "
                           "custom compare function.", kvs_name);
        }
        if (!(fhandle->flags & FHANDLE_ROOT_CUSTOM_CMP) &&
              handle->kvs_config.custom_cmp) {
            // custom cmp function was not assigned before,
            // but custom cmp function is assigned from user
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created without "
                           "custom compare function, by passing custom compare function.",
                    kvs_name);
        }
    }

    // next check other KVSs
    a = avl_first(file->kv_header->idx_name);
    while (a) {
        kvs_node = _get_entry(a, struct kvs_node, avl_name);
        a = avl_next(a);

        if (kvs_node->flags & KVS_FLAG_CUSTOM_CMP &&
            kvs_node->custom_cmp == NULL) {
            // custom cmp function was assigned before,
            // but no custom cmp function is assigned
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created with "
                           "custom compare function enabled, without passing the same "
                           "custom compare function.", kvs_name);
        }
        if (!(kvs_node->flags & KVS_FLAG_CUSTOM_CMP) &&
              kvs_node->custom_cmp) {
            // custom cmp function was not assigned before,
            // but custom cmp function is assigned from user
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created without "
                           "custom compare function, by passing custom compare function.",
                           kvs_name);
        }
    }

    spin_unlock(&file->kv_header->lock);
    return FDB_RESULT_SUCCESS;
}